

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void sigint_handler(int signo)

{
  printf("\x1b[0m");
  if (signo == 2) {
    if (is_interacting != '\0') {
      _exit(0x82);
    }
    is_interacting = '\x01';
  }
  return;
}

Assistant:

void sigint_handler(int signo) {
    printf(ANSI_COLOR_RESET);
    if (signo == SIGINT) {
        if (!is_interacting) {
            is_interacting=true;
        } else {
            _exit(130);
        }
    }
}